

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O0

void vtt_dump(vtt_t *head)

{
  vtt_t *in_stack_00000030;
  
  _dump(in_stack_00000030);
  return;
}

Assistant:

void vtt_dump(vtt_t* head) { _dump(head); }